

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O0

void __thiscall cmCTestMultiProcessHandler::ReadCostData(cmCTestMultiProcessHandler *this)

{
  float fVar1;
  int iVar2;
  bool bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  char *pcVar6;
  istream *piVar7;
  size_type sVar8;
  string *psVar9;
  mapped_type *ppcVar10;
  double dVar11;
  string local_2d8;
  int local_2b4;
  float local_2b0;
  int index;
  float cost;
  int prev;
  string name;
  undefined1 local_280 [8];
  vector<cmsys::String,_std::allocator<cmsys::String>_> parts;
  string line;
  ifstream fin;
  undefined1 local_30 [8];
  string fname;
  cmCTestMultiProcessHandler *this_local;
  
  fname.field_2._8_8_ = this;
  cmCTest::GetCostDataFile_abi_cxx11_((string *)local_30,this->CTest);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  bVar3 = cmsys::SystemTools::FileExists(pcVar6,true);
  if (bVar3) {
    std::ifstream::ifstream((void *)((long)&line.field_2 + 8));
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(line.field_2._M_local_buf + 8,_Var4);
    std::__cxx11::string::string
              ((string *)
               &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    do {
      piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),
                          (string *)
                          &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
      if ((!bVar3) ||
         (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&parts.
                                      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"---"),
         bVar3)) goto LAB_00595962;
      cmsys::SystemTools::SplitString
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280,
                 (string *)
                 &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,' ',false);
      sVar8 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                        ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280);
      if (sVar8 < 3) {
        std::ifstream::close();
        name.field_2._12_4_ = 1;
      }
      else {
        psVar9 = (string *)
                 std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                           ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280,0);
        std::__cxx11::string::string((string *)&cost,psVar9);
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                  ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280,1);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        index = atoi(pcVar6);
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                  ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280,2);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        dVar11 = atof(pcVar6);
        local_2b0 = (float)dVar11;
        std::__cxx11::string::string((string *)&local_2d8,(string *)&cost);
        iVar5 = SearchByName(this,&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
        iVar2 = index;
        local_2b4 = iVar5;
        if (iVar5 == -1) {
          name.field_2._12_4_ = 2;
        }
        else {
          ppcVar10 = std::
                     map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                     ::operator[](&(this->Properties).
                                   super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                  ,&local_2b4);
          (*ppcVar10)->PreviousRuns = iVar2;
          if ((1 < this->ParallelLevel) &&
             (ppcVar10 = std::
                         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ::operator[](&(this->Properties).
                                       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                      ,&local_2b4), *ppcVar10 != (mapped_type)0x0)) {
            ppcVar10 = std::
                       map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                       ::operator[](&(this->Properties).
                                     super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                    ,&local_2b4);
            fVar1 = local_2b0;
            if (((*ppcVar10)->Cost == 0.0) && (!NAN((*ppcVar10)->Cost))) {
              ppcVar10 = std::
                         map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ::operator[](&(this->Properties).
                                       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                      ,&local_2b4);
              (*ppcVar10)->Cost = fVar1;
            }
          }
          name.field_2._12_4_ = 0;
        }
        std::__cxx11::string::~string((string *)&cost);
      }
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_280);
    } while ((name.field_2._12_4_ == 0) || (name.field_2._12_4_ == 2));
    goto LAB_00595a0a;
  }
  goto LAB_00595a4a;
LAB_00595962:
  while( true ) {
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(line.field_2._M_local_buf + 8),
                        (string *)
                        &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar3 = std::ios::operator_cast_to_bool((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
    if (!bVar3) break;
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LastTestsFailed,
                  (value_type *)
                  &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
    }
  }
  std::ifstream::close();
  name.field_2._12_4_ = 0;
LAB_00595a0a:
  std::__cxx11::string::~string
            ((string *)
             &parts.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  if (name.field_2._12_4_ != 0) goto LAB_00595a54;
LAB_00595a4a:
  name.field_2._12_4_ = 0;
LAB_00595a54:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::ReadCostData()
{
  std::string fname = this->CTest->GetCostDataFile();

  if(cmSystemTools::FileExists(fname.c_str(), true))
    {
    cmsys::ifstream fin;
    fin.open(fname.c_str());
    std::string line;
    while(std::getline(fin, line))
      {
      if(line == "---") break;

      std::vector<cmsys::String> parts =
        cmSystemTools::SplitString(line, ' ');

      // Probably an older version of the file, will be fixed next run
      if(parts.size() < 3)
        {
        fin.close();
        return;
        }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if(index == -1) continue;

      this->Properties[index]->PreviousRuns = prev;
      // When not running in parallel mode, don't use cost data
      if(this->ParallelLevel > 1 &&
         this->Properties[index] &&
         this->Properties[index]->Cost == 0)
        {
        this->Properties[index]->Cost = cost;
        }
      }
    // Next part of the file is the failed tests
    while(std::getline(fin, line))
      {
      if(line != "")
        {
        this->LastTestsFailed.push_back(line);
        }
      }
    fin.close();
    }
}